

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<Assimp::FILongValue>
Assimp::FILongValue::create(vector<long,_std::allocator<long>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FILongValue> sVar2;
  pointer local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<Assimp::FILongValueImpl,std::vector<long,std::allocator<long>>>
            ((vector<long,_std::allocator<long>_> *)&local_18);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (value->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_start
       = local_18;
  (value->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)_Var1._M_pi;
  local_18 = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<Assimp::FILongValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Assimp::FILongValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)value;
  return (shared_ptr<Assimp::FILongValue>)
         sVar2.super___shared_ptr<Assimp::FILongValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FILongValue> FILongValue::create(std::vector<int64_t> &&value) {
    return std::make_shared<FILongValueImpl>(std::move(value));
}